

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O0

void __thiscall hrgls::datablob::DataBlob::DataBlob(DataBlob *this,DataBlob *copy)

{
  hrgls_Status hVar1;
  DataBlob_private *pDVar2;
  hrgls_DataBlob phVar3;
  DataBlob *copy_local;
  DataBlob *this_local;
  
  this->m_private = (DataBlob_private *)0x0;
  pDVar2 = (DataBlob_private *)operator_new(0x10);
  memset(pDVar2,0,0x10);
  DataBlob_private::DataBlob_private(pDVar2);
  this->m_private = pDVar2;
  pDVar2 = this->m_private;
  phVar3 = RawDataBlob(copy);
  hVar1 = hrgls_DataBlobCopy(pDVar2,phVar3);
  this->m_private->status = hVar1;
  return;
}

Assistant:

DataBlob::DataBlob(const DataBlob&copy)
    {
      m_private = new DataBlob_private();
      m_private->status = hrgls_DataBlobCopy(&m_private->blob, copy.RawDataBlob());
    }